

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O2

int onig_st_insert(st_table *table,st_data_t key,st_data_t value)

{
  st_table_entry **ppsVar1;
  uint uVar2;
  int iVar3;
  st_table_entry *psVar4;
  ulong uVar5;
  st_table_entry *psVar6;
  
  uVar2 = (*table->type->hash)(key);
  uVar5 = (ulong)uVar2 % (ulong)(uint)table->num_bins;
  psVar4 = table->bins[uVar5];
  if (psVar4 == (st_table_entry *)0x0) {
LAB_00129620:
    if (5 < table->num_entries / table->num_bins) {
      rehash(table);
      uVar5 = (ulong)uVar2 % (ulong)(uint)table->num_bins;
    }
    psVar4 = (st_table_entry *)malloc(0x20);
    if (psVar4 == (st_table_entry *)0x0) {
      iVar3 = -5;
    }
    else {
      psVar4->hash = uVar2;
      psVar4->key = key;
      psVar4->record = value;
      ppsVar1 = table->bins;
      psVar4->next = ppsVar1[uVar5];
      ppsVar1[uVar5] = psVar4;
      table->num_entries = table->num_entries + 1;
      iVar3 = 0;
    }
  }
  else {
    if ((psVar4->hash != uVar2) ||
       ((psVar4->key != key && (iVar3 = (*table->type->compare)(key,psVar4->key), iVar3 != 0)))) {
      do {
        do {
          psVar6 = psVar4;
          psVar4 = psVar6->next;
          if (psVar4 == (st_table_entry *)0x0) goto LAB_00129620;
        } while (psVar4->hash != uVar2);
        if (psVar4->key == key) goto LAB_00129614;
        iVar3 = (*table->type->compare)(key,psVar4->key);
        psVar4 = psVar6->next;
      } while (iVar3 != 0);
      if (psVar4 == (st_table_entry *)0x0) goto LAB_00129620;
    }
LAB_00129614:
    psVar4->record = value;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

extern int
st_insert(register st_table* table, register st_data_t key, st_data_t value)
{
  unsigned int hash_val, bin_pos;
  register st_table_entry *ptr;

  hash_val = do_hash(key, table);
  FIND_ENTRY(table, ptr, hash_val, bin_pos);

  if (ptr == 0) {
    ADD_DIRECT(table, key, value, hash_val, bin_pos, ONIGERR_MEMORY);
    return 0;
  }
  else {
    ptr->record = value;
    return 1;
  }
}